

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::fixUpResidualMask(MLNodeLaplacian *this,int amrlev,iMultiFab *resmsk)

{
  int iVar1;
  bool bVar2;
  undefined8 in_RDX;
  FabArrayBase *in_RDI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *fmsk;
  Array4<int> *rmsk;
  Box *bx;
  MFIter mfi;
  iMultiFab *cfmask;
  MLNodeLinOp *in_stack_00000838;
  size_type in_stack_fffffffffffffd68;
  MFIter *in_stack_fffffffffffffd70;
  FabArray<amrex::IArrayBox> *this_00;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int iVar3;
  int local_258;
  int local_254;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 local_1c8 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  MFIter local_158;
  RefID local_f8;
  undefined1 uStack_e9;
  unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
  local_d8;
  int local_d0;
  MFIter *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  pointer local_b0;
  int local_a8;
  MultiArray4<int> local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  int local_74;
  int local_70;
  int local_6c;
  FabArray<amrex::IArrayBox> *local_68;
  undefined4 local_5c;
  unique_ptr<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  local_58;
  undefined4 local_4c;
  _Atomic_word *local_48;
  undefined4 local_3c;
  _Atomic_word *local_38;
  undefined4 local_2c;
  MFIter *local_28;
  undefined4 local_1c;
  MFIter *local_18;
  undefined4 local_c;
  MFIter *local_8;
  
  uStack_e9 = (undefined1)((ulong)in_RDX >> 0x38);
  if ((in_RDI[5].ownership.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xd & 1) == 0) {
    MLNodeLinOp::buildMasks(in_stack_00000838);
  }
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_f8.data =
       (BARef *)std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                          ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                           in_stack_fffffffffffffd70);
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_RDI,
                 (bool)uStack_e9);
  while (bVar2 = MFIter::isValid(&local_158), bVar2) {
    in_stack_fffffffffffffd70 = (MFIter *)(local_1c8 + 0x4c);
    MFIter::tilebox((MFIter *)in_stack_fffffffffffffdd0._M_head_impl);
    this_00 = (FabArray<amrex::IArrayBox> *)local_1c8;
    local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffd70;
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>(this_00,in_stack_fffffffffffffd70);
    local_1c8._64_8_ = this_00;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(this_00,in_stack_fffffffffffffd70);
    local_c8 = (MFIter *)local_160._M_pi;
    local_8 = (MFIter *)local_160._M_pi;
    local_c = 0;
    local_bc = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           *)&(local_160._M_pi)->_vptr__Sp_counted_base)->_M_t).
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_18 = (MFIter *)local_160._M_pi;
    local_1c = 1;
    iStack_b8 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   *)&(local_160._M_pi)->_vptr__Sp_counted_base)->_M_t).
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                        4);
    in_stack_fffffffffffffdd0._M_head_impl =
         (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
          &(local_160._M_pi)->_vptr__Sp_counted_base)->_M_t).
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_28 = (MFIter *)local_160._M_pi;
    local_2c = 2;
    local_d0 = (local_160._M_pi)->_M_use_count;
    local_a0.hp = (Array4<int> *)local_160._M_pi;
    local_38 = &(local_160._M_pi)->_M_weak_count;
    local_3c = 0;
    local_98 = *local_38;
    local_48 = &(local_160._M_pi)->_M_weak_count;
    local_4c = 1;
    iStack_94 = *(int *)&local_160._M_pi[1]._vptr__Sp_counted_base;
    local_b0 = *(pointer *)local_38;
    local_58._M_t.
    super___uniq_ptr_impl<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::IArrayBox>_*,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::IArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>,_true,_true>
          )&(local_160._M_pi)->_M_weak_count;
    local_5c = 2;
    local_a8 = *(int *)((long)&local_160._M_pi[1]._vptr__Sp_counted_base + 4);
    for (local_254 = local_d0; local_258 = iStack_b8, local_254 <= local_a8;
        local_254 = local_254 + 1) {
      for (; iVar1 = local_bc, local_258 <= iStack_94; local_258 = local_258 + 1) {
        while (iVar3 = iVar1, iVar3 <= local_98) {
          local_88 = local_258;
          local_8c = local_254;
          if (*(int *)(local_210._0_8_ +
                      ((long)(iVar3 - local_1f0) +
                       (long)(local_258 - local_1ec) * local_210._M_string_length +
                      (long)(local_254 - local_1e8) * local_210.field_2._M_allocated_capacity) * 4)
              == 1) {
            local_68 = (FabArray<amrex::IArrayBox> *)local_1c8._64_8_;
            local_70 = local_258;
            local_74 = local_254;
            *(undefined4 *)
             (*(long *)local_1c8._64_8_ +
             ((long)(iVar3 - *(int *)(local_1c8._64_8_ + 0x20)) +
              (long)(local_258 - *(int *)(local_1c8._64_8_ + 0x24)) *
              *(long *)&((BoxArray *)(local_1c8._64_8_ + 8))->m_bat +
             (long)(local_254 - *(int *)(local_1c8._64_8_ + 0x28)) *
             *(long *)(local_1c8._64_8_ + 0x10)) * 4) = 1;
            local_6c = iVar3;
          }
          local_84 = iVar3;
          local_80 = &local_210;
          iVar1 = iVar3 + 1;
        }
      }
    }
    local_1d0 = &local_210;
    local_d8._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>,_true,_true>
          )(__uniq_ptr_data<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>,_true,_true>
            )in_stack_fffffffffffffdd0._M_head_impl;
    local_b4 = local_d0;
    local_90 = local_a8;
    MFIter::operator++(&local_158);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd70);
  return;
}

Assistant:

void
MLNodeLaplacian::fixUpResidualMask (int amrlev, iMultiFab& resmsk)
{
    if (!m_masks_built) buildMasks();

    const iMultiFab& cfmask = *m_nd_fine_mask[amrlev];

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(resmsk,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<int> const& rmsk = resmsk.array(mfi);
        Array4<int const> const& fmsk = cfmask.const_array(mfi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
        {
            if (fmsk(i,j,k) == crse_fine_node) rmsk(i,j,k) = 1;
        });
    }
}